

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

int read_buf(z_streamp strm,Bytef *buf,uint size)

{
  uLong uVar1;
  uint in_EDX;
  void *in_RSI;
  long *in_RDI;
  uint len;
  uint in_stack_ffffffffffffffdc;
  uint local_4;
  
  local_4 = *(uint *)(in_RDI + 1);
  if (in_EDX < *(uint *)(in_RDI + 1)) {
    local_4 = in_EDX;
  }
  if (local_4 == 0) {
    local_4 = 0;
  }
  else {
    *(uint *)(in_RDI + 1) = (int)in_RDI[1] - local_4;
    if (*(int *)(in_RDI[7] + 0x2c) == 1) {
      uVar1 = adler32(in_RDI[0xc],(Bytef *)*in_RDI,local_4);
      in_RDI[0xc] = uVar1;
    }
    else if (*(int *)(in_RDI[7] + 0x2c) == 2) {
      uVar1 = crc32((unsigned_long)in_RSI,(uchar *)CONCAT44(in_EDX,local_4),
                    in_stack_ffffffffffffffdc);
      in_RDI[0xc] = uVar1;
    }
    memcpy(in_RSI,(void *)*in_RDI,(ulong)local_4);
    *in_RDI = *in_RDI + (ulong)local_4;
    in_RDI[2] = (ulong)local_4 + in_RDI[2];
  }
  return local_4;
}

Assistant:

local int read_buf(strm, buf, size)
    z_streamp strm;
    Bytef *buf;
    unsigned size;
{
    unsigned len = strm->avail_in;

    if (len > size) len = size;
    if (len == 0) return 0;

    strm->avail_in  -= len;

    if (strm->state->wrap == 1) {
        strm->adler = adler32(strm->adler, strm->next_in, len);
    }
#ifdef GZIP
    else if (strm->state->wrap == 2) {
        strm->adler = crc32(strm->adler, strm->next_in, len);
    }
#endif
    zmemcpy(buf, strm->next_in, len);
    strm->next_in  += len;
    strm->total_in += len;

    return (int)len;
}